

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables_map.cpp
# Opt level: O0

variable_value * __thiscall program_options::variables_map::get(variables_map *this,string *name)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  variable_value *in_RDI;
  const_iterator i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_38;
  _Self local_30 [5];
  variable_value *local_8;
  
  if (get(std::__cxx11::string_const&)::empty == '\0') {
    iVar2 = __cxa_guard_acquire(&get(std::__cxx11::string_const&)::empty);
    if (iVar2 != 0) {
      variable_value::variable_value(in_RDI);
      __cxa_atexit(variable_value::~variable_value,&get::empty,&__dso_handle);
      __cxa_guard_release(&get(std::__cxx11::string_const&)::empty);
    }
  }
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x2086d9);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::operator==(local_30,&local_38);
  if (bVar1) {
    local_8 = &get::empty;
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>
                           *)0x20873a);
    local_8 = &ppVar3->second;
  }
  return local_8;
}

Assistant:

const variable_value& variables_map::get(const std::string& name) const
{
    static variable_value empty;
    const_iterator i = this->find(name);
    if (i == this->end())
        return empty;
    else
        return i->second;
}